

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::Range::Range<double>(Range *this,double min_val,double max_val,string *validator_name)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  stringstream out;
  anon_class_16_2_ee34707b *in_stack_fffffffffffffdd8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffdf8;
  Validator *in_stack_fffffffffffffe00;
  string local_1f8 [32];
  stringstream local_1d8 [16];
  anon_class_16_2_ee34707b local_1c8 [24];
  string local_40 [40];
  double local_18;
  double local_10;
  
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  ::std::__cxx11::string::string(local_40,in_RSI);
  Validator::Validator(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  ::std::__cxx11::string::~string(local_40);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    ::std::__cxx11::stringstream::stringstream(local_1d8);
    in_stack_fffffffffffffdd8 = local_1c8;
    pcVar2 = detail::type_name<double,_(CLI::detail::enabler)0>();
    in_stack_fffffffffffffde0 =
         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)::std::operator<<((ostream *)in_stack_fffffffffffffdd8,pcVar2);
    poVar3 = ::std::operator<<((ostream *)in_stack_fffffffffffffde0," in [");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_10);
    poVar3 = ::std::operator<<(poVar3," - ");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_18);
    ::std::operator<<(poVar3,"]");
    ::std::__cxx11::stringstream::str();
    Validator::description(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    ::std::__cxx11::string::~string(local_1f8);
    ::std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  return;
}

Assistant:

Range(T min_val, T max_val, const std::string &validator_name = std::string{}) : Validator(validator_name) {
        if(validator_name.empty()) {
            std::stringstream out;
            out << detail::type_name<T>() << " in [" << min_val << " - " << max_val << "]";
            description(out.str());
        }

        func_ = [min_val, max_val](std::string &input) {
            using CLI::detail::lexical_cast;
            T val;
            bool converted = lexical_cast(input, val);
            if((!converted) || (val < min_val || val > max_val)) {
                std::stringstream out;
                out << "Value " << input << " not in range [";
                out << min_val << " - " << max_val << "]";
                return out.str();
            }
            return std::string{};
        };
    }